

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::replaceWithNewBasis(HModel *this,int *XbasicIndex)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  
  if (0 < this->numTot) {
    piVar2 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      piVar2[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->numTot);
  }
  this->numBasicLogicals = 0;
  if (0 < this->numRow) {
    piVar2 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      iVar1 = XbasicIndex[lVar4];
      if (this->numCol <= iVar1) {
        this->numBasicLogicals = this->numBasicLogicals + 1;
      }
      piVar2[lVar4] = iVar1;
      piVar3[iVar1] = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->numRow);
  }
  populate_WorkArrays(this);
  mlFg_Update(this,this->mlFg_action_NewBasis);
  return;
}

Assistant:

void HModel::replaceWithNewBasis(const int* XbasicIndex) {
  // Replace basis with a new basis then populate (where possible)
  // work* arrays

  //  printf("replaceWithNewBasis: \n");
  for (int var = 0; var < numTot; var++) {
    nonbasicFlag[var] = NONBASIC_FLAG_TRUE;
  }
  numBasicLogicals = 0;
  for (int row = 0; row < numRow; row++) {
    int var = XbasicIndex[row];
    if (var >= numCol) numBasicLogicals++;
    basicIndex[row] = var;
    nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
  }

  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}